

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::BlindIssuance
          (ConfidentialTransactionContext *this,
          map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          *issuance_key_map,
          vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
          *confidential_addresses,int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *blinder_list)

{
  pointer pCVar1;
  bool bVar2;
  CfdException *this_00;
  pointer this_01;
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  utxo_info_map;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  confidential_addrs;
  BlindFactor local_5e0;
  BlindFactor local_5c0;
  ConfidentialValue local_5a0;
  ConfidentialValue local_570;
  OutPoint outpoint;
  UtxoData utxo;
  
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  UtxoData::UtxoData(&utxo);
  this_01 = (this->super_ConfidentialTransaction).vin_.
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->super_ConfidentialTransaction).vin_.
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_01 == pCVar1) {
      confidential_addrs.
      super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      confidential_addrs.
      super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      confidential_addrs.
      super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (confidential_addresses !=
          (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
           *)0x0) {
        std::
        vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
        ::operator=(&confidential_addrs,confidential_addresses);
      }
      BlindTransaction(this,&utxo_info_map,issuance_key_map,&confidential_addrs,minimum_range_value,
                       exponent,minimum_bits,blinder_list);
      std::
      vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
      ::~vector(&confidential_addrs);
      UtxoData::~UtxoData(&utxo);
      std::
      _Rb_tree<cfd::core::OutPoint,_std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>,_std::_Select1st<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
      ::~_Rb_tree(&utxo_info_map._M_t);
      return;
    }
    core::AbstractTxIn::GetOutPoint(&outpoint,&this_01->super_AbstractTxIn);
    bVar2 = IsFindUtxoMap(this,&outpoint,&utxo);
    if (!bVar2) break;
    core::UnblindParameter::UnblindParameter((UnblindParameter *)&confidential_addrs);
    core::ConfidentialAssetId::operator=((ConfidentialAssetId *)&confidential_addrs,&utxo.asset);
    core::BlindFactor::operator=(&local_5e0,&utxo.asset_blind_factor);
    core::BlindFactor::operator=(&local_5c0,&utxo.amount_blind_factor);
    core::ConfidentialValue::ConfidentialValue(&local_570,&utxo.amount);
    core::ConfidentialValue::operator=(&local_5a0,&local_570);
    core::ConfidentialValue::~ConfidentialValue(&local_570);
    std::
    _Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>>
    ::_M_emplace_unique<cfd::core::OutPoint&,cfd::core::UnblindParameter&>
              ((_Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>>
                *)&utxo_info_map,&outpoint,(UnblindParameter *)&confidential_addrs);
    core::UnblindParameter::~UnblindParameter((UnblindParameter *)&confidential_addrs);
    core::Txid::~Txid(&outpoint.txid_);
    this_01 = this_01 + 1;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&confidential_addrs,"Utxo is not found. blind fail.",(allocator *)&local_570)
  ;
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&confidential_addrs);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void ConfidentialTransactionContext::BlindIssuance(
    const std::map<OutPoint, IssuanceBlindingKeyPair>& issuance_key_map,
    const std::vector<ElementsConfidentialAddress>* confidential_addresses,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<BlindData>* blinder_list) {
  std::map<OutPoint, BlindParameter> utxo_info_map;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint = txin_ref.GetOutPoint();
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Utxo is not found. blind fail.");
    }
    BlindParameter param;
    param.asset = utxo.asset;
    param.abf = utxo.asset_blind_factor;
    param.vbf = utxo.amount_blind_factor;
    param.value = ConfidentialValue(utxo.amount);
    utxo_info_map.emplace(outpoint, param);
  }
  // confidentialkey is already set to nonce.

  std::vector<ElementsConfidentialAddress> confidential_addrs;
  if (confidential_addresses != nullptr) {
    // set updating keys.
    confidential_addrs = *confidential_addresses;
  }
  BlindTransaction(
      utxo_info_map, issuance_key_map, confidential_addrs, minimum_range_value,
      exponent, minimum_bits, blinder_list);
}